

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::mouseMoveEvent(QGraphicsItem *this,QGraphicsSceneMouseEvent *event)

{
  QGraphicsScene *this_00;
  long lVar1;
  ulong uVar2;
  qreal qVar3;
  QGraphicsItem **ppQVar4;
  bool bVar5;
  MouseButtons MVar6;
  QPointF *pQVar7;
  QWidget *pQVar8;
  QGraphicsItemPrivate *pQVar9;
  QPoint QVar10;
  long lVar11;
  long lVar12;
  QTransform *pQVar13;
  qreal *pqVar14;
  QGraphicsItem *pQVar15;
  QTransform *pQVar16;
  ulong uVar17;
  bool bVar18;
  long in_FS_OFFSET;
  byte bVar19;
  double dVar20;
  double in_XMM1_Qa;
  qreal qVar21;
  double dVar22;
  QPointF QVar23;
  qreal local_298;
  QWidget *local_280;
  qreal local_268;
  QGraphicsItem *local_248;
  QHash<QGraphicsItem_*,_QPointF> local_240;
  QArrayDataPointer<QGraphicsItem_*> local_238;
  QTransform local_218;
  QTransform local_1c8;
  QTransform local_178;
  QTransform local_128;
  QTransform viewToParentTransform;
  QGraphicsItem *item;
  QGraphicsItem **ppQStack_80;
  undefined2 local_40;
  long local_38;
  
  bVar19 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MVar6 = QGraphicsSceneMouseEvent::buttons(event);
  if ((((uint)MVar6.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
              super_QFlagsStorage<Qt::MouseButton>.i & 1) == 0) ||
     (pQVar9 = (this->d_ptr).d, (pQVar9->field_0x164 & 1) == 0)) {
    (event->super_QGraphicsSceneEvent).field_0xc = 0;
  }
  else {
    local_238.size = 0;
    local_240.d = (Data *)0x0;
    local_238.d = (Data *)0x0;
    local_238.ptr = (QGraphicsItem **)0x0;
    this_00 = (QGraphicsScene *)pQVar9->scene;
    if (this_00 != (QGraphicsScene *)0x0) {
      QGraphicsScene::selectedItems((QList<QGraphicsItem_*> *)&item,this_00);
      QArrayDataPointer<QGraphicsItem_*>::operator=
                (&local_238,(QArrayDataPointer<QGraphicsItem_*> *)&item);
      QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer
                ((QArrayDataPointer<QGraphicsItem_*> *)&item);
      QHash<QGraphicsItem_*,_QPointF>::operator=
                (&local_240,
                 (QHash<QGraphicsItem_*,_QPointF> *)
                 (*(long *)&((this->d_ptr).d)->scene->field_0x8 + 0x160));
      ppQVar4 = local_238.ptr;
      if ((local_240.d == (Data *)0x0) || ((local_240.d)->size == 0)) {
        lVar12 = local_238.size << 3;
        for (lVar11 = 0; lVar12 != lVar11; lVar11 = lVar11 + 8) {
          item = (QGraphicsItem *)*(qreal *)((long)ppQVar4 + lVar11);
          lVar1 = *(long *)((long)*(qreal *)((long)ppQVar4 + lVar11) + 8);
          qVar21 = *(qreal *)(lVar1 + 0x68);
          qVar3 = *(qreal *)(lVar1 + 0x70);
          pQVar7 = QHash<QGraphicsItem_*,_QPointF>::operator[](&local_240,&item);
          pQVar7->xp = qVar21;
          pQVar7->yp = qVar3;
        }
        pQVar9 = (this->d_ptr).d;
        item = this;
        qVar21 = (pQVar9->pos).xp;
        qVar3 = (pQVar9->pos).yp;
        pQVar7 = QHash<QGraphicsItem_*,_QPointF>::operator[](&local_240,&item);
        pQVar7->xp = qVar21;
        pQVar7->yp = qVar3;
      }
      QHash<QGraphicsItem_*,_QPointF>::operator=
                ((QHash<QGraphicsItem_*,_QPointF> *)
                 (*(long *)&((this->d_ptr).d)->scene->field_0x8 + 0x160),&local_240);
    }
    pQVar8 = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
    if (pQVar8 == (QWidget *)0x0) {
      local_280 = (QWidget *)0x0;
    }
    else {
      pQVar8 = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
      local_280 = (QWidget *)
                  QtPrivate::qobject_cast_helper<QGraphicsView*,QObject>
                            (*(QObject **)(*(long *)&pQVar8->field_0x8 + 0x10));
    }
    uVar17 = 0;
    bVar18 = false;
    while ((uVar17 <= (ulong)local_238.size &&
           (((local_248 = this, uVar17 < (ulong)local_238.size &&
             (local_248 = local_238.ptr[uVar17], local_248 != this)) ||
            (bVar5 = !bVar18, bVar18 = true, bVar5))))) {
      if (((*(ulong *)&((local_248->d_ptr).d)->field_0x160 & 0x100000000) != 0) &&
         (bVar5 = QGraphicsItemPrivate::movableAncestorIsSelected(local_248), pQVar15 = local_248,
         !bVar5)) {
        if (local_280 == (QWidget *)0x0) {
LAB_0057a6f1:
          QVar23 = QGraphicsSceneMouseEvent::scenePos(event);
          viewToParentTransform.m_matrix[0][1] = QVar23.yp;
          viewToParentTransform.m_matrix[0][0] = QVar23.xp;
          QVar23 = mapFromScene(pQVar15,(QPointF *)&viewToParentTransform);
          ppQStack_80 = (QGraphicsItem **)QVar23.yp;
          item = (QGraphicsItem *)QVar23.xp;
          QVar23 = mapToParent(pQVar15,(QPointF *)&item);
          pQVar15 = local_248;
          local_268 = QVar23.yp;
          local_298 = QVar23.xp;
          QVar23 = QGraphicsSceneMouseEvent::buttonDownScenePos(event,LeftButton);
          viewToParentTransform.m_matrix[0][1] = QVar23.yp;
          viewToParentTransform.m_matrix[0][0] = QVar23.xp;
          pQVar7 = (QPointF *)&item;
          _item = mapFromScene(pQVar15,(QPointF *)&viewToParentTransform);
LAB_0057a8eb:
          QVar23 = mapToParent(pQVar15,pQVar7);
          dVar22 = QVar23.yp;
          dVar20 = QVar23.xp;
        }
        else {
          uVar2 = *(ulong *)&((local_248->d_ptr).d)->field_0x160;
          if (((uint)uVar2 >> 0x12 & 1) != 0) {
            pqVar14 = (qreal *)&DAT_00677848;
            pQVar13 = (QTransform *)&item;
            for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
              pQVar13->m_matrix[0][0] = *pqVar14;
              pqVar14 = pqVar14 + (ulong)bVar19 * -2 + 1;
              pQVar13 = (QTransform *)((long)pQVar13 + ((ulong)bVar19 * -2 + 1) * 8);
            }
            QGraphicsView::viewportTransform(&local_128,(QGraphicsView *)local_280);
            pQVar7 = (QPointF *)&viewToParentTransform;
            deviceTransform((QTransform *)pQVar7,pQVar15,&local_128);
            QTransform::inverted((bool *)&item);
            local_178.m_matrix[0][0] = (qreal)QGraphicsSceneMouseEvent::screenPos(event);
            QVar10 = QWidget::mapFromGlobal(local_280,(QPoint *)&local_178);
            local_128.m_matrix[0][0] = (qreal)QVar10.xp.m_i.m_i;
            local_128.m_matrix[0][1] = (qreal)QVar10.yp.m_i.m_i;
            viewToParentTransform.m_matrix[0][0] = (qreal)QTransform::map((QPointF *)&item);
            viewToParentTransform.m_matrix[0][1] = in_XMM1_Qa;
            QVar23 = mapToParent(this,pQVar7);
            local_268 = QVar23.yp;
            local_298 = QVar23.xp;
            qVar21 = local_268;
            local_178.m_matrix[0][0] =
                 (qreal)QGraphicsSceneMouseEvent::buttonDownScreenPos(event,LeftButton);
            QVar10 = QWidget::mapFromGlobal(local_280,(QPoint *)&local_178);
            local_128.m_matrix[0][0] = (qreal)QVar10.xp.m_i.m_i;
            local_128.m_matrix[0][1] = (qreal)QVar10.yp.m_i.m_i;
            viewToParentTransform.m_matrix[0][0] = (qreal)QTransform::map((QPointF *)&item);
            pQVar15 = this;
            viewToParentTransform.m_matrix[0][1] = qVar21;
            goto LAB_0057a8eb;
          }
          if ((uVar2 >> 0x25 & 1) == 0) goto LAB_0057a6f1;
          pqVar14 = (qreal *)&DAT_00677848;
          pQVar13 = (QTransform *)&item;
          for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
            pQVar13->m_matrix[0][0] = *pqVar14;
            pqVar14 = pqVar14 + (ulong)bVar19 * -2 + 1;
            pQVar13 = (QTransform *)((long)pQVar13 + ((ulong)bVar19 * -2 + 1) * 8);
          }
          pqVar14 = (qreal *)&DAT_006777b8;
          pQVar13 = (QTransform *)&item;
          for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
            pQVar13->m_matrix[0][0] = *pqVar14;
            pqVar14 = pqVar14 + (ulong)bVar19 * -2 + 1;
            pQVar13 = (QTransform *)((long)pQVar13 + ((ulong)bVar19 * -2 + 1) * 8);
          }
          local_40 = 0xa800;
          pQVar9 = (local_248->d_ptr).d;
          if (pQVar9->transformData != (TransformData *)0x0) {
            QGraphicsItemPrivate::TransformData::computedFullTransform
                      (&viewToParentTransform,pQVar9->transformData,(QTransform *)0x0);
            pQVar13 = &viewToParentTransform;
            pQVar16 = (QTransform *)&item;
            for (lVar11 = 0x4a; lVar11 != 0; lVar11 = lVar11 + -1) {
              *(undefined1 *)pQVar16->m_matrix[0] = *(undefined1 *)pQVar13->m_matrix[0];
              pQVar13 = (QTransform *)((long)pQVar13 + (ulong)bVar19 * -2 + 1);
              pQVar16 = (QTransform *)((long)pQVar16 + (ulong)bVar19 * -2 + 1);
            }
            pQVar9 = (local_248->d_ptr).d;
          }
          local_268 = (pQVar9->pos).yp;
          QTransform::translate((pQVar9->pos).xp,local_268);
          pqVar14 = (qreal *)&DAT_00677848;
          pQVar13 = &viewToParentTransform;
          for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
            pQVar13->m_matrix[0][0] = *pqVar14;
            pqVar14 = pqVar14 + (ulong)bVar19 * -2 + 1;
            pQVar13 = (QTransform *)((long)pQVar13 + ((ulong)bVar19 * -2 + 1) * 8);
          }
          sceneTransform(&local_1c8,local_248);
          QGraphicsView::viewportTransform(&local_218,(QGraphicsView *)local_280);
          QTransform::operator*(&local_178,&local_1c8);
          QTransform::inverted((bool *)&local_128);
          QTransform::operator*(&viewToParentTransform,(QTransform *)&item);
          local_178.m_matrix[0][0] = (qreal)QGraphicsSceneMouseEvent::screenPos(event);
          QVar10 = QWidget::mapFromGlobal(local_280,(QPoint *)&local_178);
          local_128.m_matrix[0][0] = (qreal)QVar10.xp.m_i.m_i;
          local_128.m_matrix[0][1] = (qreal)QVar10.yp.m_i.m_i;
          local_298 = (qreal)QTransform::map((QPointF *)&viewToParentTransform);
          dVar22 = local_268;
          local_178.m_matrix[0][0] =
               (qreal)QGraphicsSceneMouseEvent::buttonDownScreenPos(event,LeftButton);
          QVar10 = QWidget::mapFromGlobal(local_280,(QPoint *)&local_178);
          local_128.m_matrix[0][0] = (qreal)QVar10.xp.m_i.m_i;
          local_128.m_matrix[0][1] = (qreal)QVar10.yp.m_i.m_i;
          dVar20 = (double)QTransform::map((QPointF *)&viewToParentTransform);
        }
        pQVar15 = local_248;
        QVar23 = QHash<QGraphicsItem_*,_QPointF>::value(&local_240,&local_248);
        in_XMM1_Qa = QVar23.yp;
        dVar22 = (in_XMM1_Qa + local_268) - dVar22;
        unique0x10000343 = SUB84(dVar22,0);
        item = (QGraphicsItem *)((QVar23.xp + local_298) - dVar20);
        unique0x10000347 = (int)((ulong)dVar22 >> 0x20);
        setPos(pQVar15,(QPointF *)&item);
        if ((((local_248->d_ptr).d)->field_0x164 & 2) != 0) {
          setSelected(local_248,true);
        }
      }
      uVar17 = uVar17 + 1;
    }
    QHash<QGraphicsItem_*,_QPointF>::~QHash(&local_240);
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_238);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::mouseMoveEvent(QGraphicsSceneMouseEvent *event)
{
    if ((event->buttons() & Qt::LeftButton) && (flags() & ItemIsMovable)) {
        // Determine the list of items that need to be moved.
        QList<QGraphicsItem *> selectedItems;
        QHash<QGraphicsItem *, QPointF> initialPositions;
        if (d_ptr->scene) {
            selectedItems = d_ptr->scene->selectedItems();
            initialPositions = d_ptr->scene->d_func()->movingItemsInitialPositions;
            if (initialPositions.isEmpty()) {
                for (QGraphicsItem *item : std::as_const(selectedItems))
                    initialPositions[item] = item->pos();
                initialPositions[this] = pos();
            }
            d_ptr->scene->d_func()->movingItemsInitialPositions = initialPositions;
        }

        // Find the active view.
        QGraphicsView *view = nullptr;
        if (event->widget())
            view = qobject_cast<QGraphicsView *>(event->widget()->parentWidget());

        // Move all selected items
        int i = 0;
        bool movedMe = false;
        while (i <= selectedItems.size()) {
            QGraphicsItem *item = nullptr;
            if (i < selectedItems.size())
                item = selectedItems.at(i);
            else
                item = this;
            if (item == this) {
                // Slightly clumsy-looking way to ensure that "this" is part
                // of the list of items to move, this is to avoid allocations
                // (appending this item to the list of selected items causes a
                // detach).
                if (movedMe)
                    break;
                movedMe = true;
            }

            if ((item->flags() & ItemIsMovable) && !QGraphicsItemPrivate::movableAncestorIsSelected(item)) {
                QPointF currentParentPos;
                QPointF buttonDownParentPos;
                if (view && (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorIgnoresTransformations)) {
                    // Items whose ancestors ignore transformations need to
                    // map screen coordinates to local coordinates, then map
                    // those to the parent.
                    QTransform viewToItemTransform = (item->deviceTransform(view->viewportTransform())).inverted();
                    currentParentPos = mapToParent(viewToItemTransform.map(QPointF(view->mapFromGlobal(event->screenPos()))));
                    buttonDownParentPos = mapToParent(viewToItemTransform.map(QPointF(view->mapFromGlobal(event->buttonDownScreenPos(Qt::LeftButton)))));
                } else if (view && (item->flags() & ItemIgnoresTransformations)) {
                    // Root items that ignore transformations need to
                    // calculate their diff by mapping viewport coordinates
                    // directly to parent coordinates.
                    // COMBINE
                    QTransform itemTransform;
                    if (item->d_ptr->transformData)
                        itemTransform = item->d_ptr->transformData->computedFullTransform();
                    itemTransform.translate(item->d_ptr->pos.x(), item->d_ptr->pos.y());
                    QTransform viewToParentTransform = itemTransform
                                                       * (item->sceneTransform() * view->viewportTransform()).inverted();
                    currentParentPos = viewToParentTransform.map(QPointF(view->mapFromGlobal(event->screenPos())));
                    buttonDownParentPos = viewToParentTransform.map(QPointF(view->mapFromGlobal(event->buttonDownScreenPos(Qt::LeftButton))));
                } else {
                    // All other items simply map from the scene.
                    currentParentPos = item->mapToParent(item->mapFromScene(event->scenePos()));
                    buttonDownParentPos = item->mapToParent(item->mapFromScene(event->buttonDownScenePos(Qt::LeftButton)));
                }

                item->setPos(initialPositions.value(item) + currentParentPos - buttonDownParentPos);

                if (item->flags() & ItemIsSelectable)
                    item->setSelected(true);
            }
            ++i;
        }

    } else {
        event->ignore();
    }
}